

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O2

_Bool EverCrypt_DRBG_generate
                (uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,uint8_t *additional_input,
                uint32_t additional_input_len)

{
  _Bool _Var1;
  undefined8 in_R9;
  
  switch((ulong)st->tag) {
  case 0:
    _Var1 = generate_sha1(output,st,n,additional_input,additional_input_len);
    return _Var1;
  case 1:
    _Var1 = generate_sha2_256(output,st,n,additional_input,additional_input_len);
    return _Var1;
  case 2:
    _Var1 = generate_sha2_384(output,st,n,additional_input,additional_input_len);
    return _Var1;
  case 3:
    _Var1 = generate_sha2_512(output,st,n,additional_input,additional_input_len);
    return _Var1;
  default:
    fprintf(_stderr,"KaRaMeL abort at %s:%d\n%s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
            ,0x7b5,"unreachable (pattern matches are exhaustive in F*)",in_R9,(ulong)st->tag);
    exit(0xff);
  }
}

Assistant:

bool
EverCrypt_DRBG_generate(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  EverCrypt_DRBG_state_s scrut = *st;
  if (scrut.tag == SHA1_s)
  {
    return generate_sha1(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_256_s)
  {
    return generate_sha2_256(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_384_s)
  {
    return generate_sha2_384(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_512_s)
  {
    return generate_sha2_512(output, st, n, additional_input, additional_input_len);
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}